

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerFrame.hpp
# Opt level: O3

bool __thiscall Husky::ServerFrame::dispose(ServerFrame *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  sockaddr_in dest;
  string local_48;
  undefined1 local_28 [16];
  
  this->m_bShutdown = true;
  iVar1 = close(this->m_lsnSock);
  if (iVar1 == -1) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"error [%s]","");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0x5f,&local_48,pcVar4);
  }
  else {
    iVar1 = socket(2,1,0);
    if (iVar1 < 0) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"error [%s]","");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0x69,&local_48,pcVar4);
    }
    else {
      bzero(local_28,0x10);
      local_28._0_2_ = 2;
      local_28._2_2_ = this->m_nLsnPort << 8 | this->m_nLsnPort >> 8;
      iVar2 = inet_aton("127.0.0.1",(in_addr *)(local_28 + 4));
      if (iVar2 != 0) {
        iVar2 = connect(iVar1,(sockaddr *)local_28,0x10);
        if (iVar2 < 0) {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"error [%s]","");
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0x78,&local_48,pcVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p);
          }
        }
        close(iVar1);
        iVar1 = (*this->m_pHandler->_vptr_IRequestHandler[3])();
        if ((char)iVar1 != '\0') {
          return true;
        }
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"m_pHandler dispose failed.","");
        Limonp::Logger::LoggingF(4,"ServerFrame.hpp",0x7d,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p == &local_48.field_2) {
          return true;
        }
        operator_delete(local_48._M_dataplus._M_p);
        return true;
      }
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"error [%s]","");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0x72,&local_48,pcVar4);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return false;
}

Assistant:

virtual bool dispose()    
            {
                m_bShutdown=true;
                if (SOCKET_ERROR==closesocket(m_lsnSock))
                {
                    LogError("error [%s]", strerror(errno));
                    return false;
                }


                int sockfd;
                struct sockaddr_in dest;

                if ((sockfd = socket(AF_INET, SOCK_STREAM, 0)) < 0)
                {
                    LogError("error [%s]", strerror(errno));
                    return false;
                }

                bzero(&dest, sizeof(dest));
                dest.sin_family = AF_INET;
                dest.sin_port = htons(m_nLsnPort);
                if (inet_aton("127.0.0.1", (struct in_addr *) &dest.sin_addr.s_addr) == 0)
                {
                    LogError("error [%s]", strerror(errno));
                    return false;
                }

                if (connect(sockfd, (struct sockaddr *) &dest, sizeof(dest)) < 0)
                {
                    LogError("error [%s]", strerror(errno));
                }
                close(sockfd);
                if(!m_pHandler->dispose())
                {
                    LogFatal("m_pHandler dispose failed.");
                }
                return true;
            }